

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool member)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  SPIRType *pSVar6;
  SPIRVariable *pSVar7;
  char *pcVar8;
  long *plVar9;
  runtime_error *this_00;
  ulong uVar10;
  ulong *puVar11;
  uint uVar12;
  SPVFuncImpl spv_func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  char (*ts_2_00) [2];
  char (*in_R9) [2];
  uint32_t index;
  string type_address_space;
  string type_name;
  string __str;
  char *wrapper_type;
  char (*in_stack_ffffffffffffff28) [2];
  char (*in_stack_ffffffffffffff30) [4];
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  char *local_38;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  bVar3 = Compiler::is_pointer((Compiler *)this,type);
  if ((bVar3) || (bVar3 = Compiler::type_is_array_of_pointers((Compiler *)this,type), bVar3)) {
    if (type->pointer_depth == 0) {
      __assert_fail("type.pointer_depth > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x3e96,
                    "string spirv_cross::CompilerMSL::type_to_glsl(const SPIRType &, uint32_t, bool)"
                   );
    }
    ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    get_type_address_space_abi_cxx11_(&local_c0,this,type,id,false);
    pSVar6 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + (type->parent_type).id);
    if (member && id != 0) {
      pSVar7 = Variant::get<spirv_cross::SPIRVariable>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + id);
      bVar3 = is_var_runtime_size_array(this,pSVar7);
      if ((!bVar3) || (bVar3 = Compiler::is_runtime_size_array(pSVar6), !bVar3)) goto LAB_0022622d;
      bVar3 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar6->super_IVariant).self.id,DecorationBufferBlock
                        );
      if (bVar3 || pSVar7->storage == StorageClassStorageBuffer) {
        bVar3 = (this->msl_options).runtime_array_rich_descriptor;
        local_38 = "spvDescriptor";
        if (bVar3 != false) {
          local_38 = "spvBufferDescriptor";
        }
        spv_func = bVar3 | SPVFuncImplVariableDescriptor;
      }
      else {
        local_38 = "spvDescriptor";
        spv_func = SPVFuncImplVariableDescriptor;
      }
      add_spv_func_and_recompile(this,SPVFuncImplVariableDescriptorArray);
      add_spv_func_and_recompile(this,spv_func);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_60,this,pSVar6,(ulong)id);
      join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[4]>
                (&local_80,(spirv_cross *)&local_38,(char **)0x2d0d35,(char (*) [2])&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1,
                 (char (*) [2])local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" *>",
                 in_stack_ffffffffffffff30);
      ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if (local_60[0] != local_50) {
        operator_delete(local_60[0]);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,local_a0.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_a0.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_a0._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,local_a0.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_a0._M_string_length;
    }
    else {
LAB_0022622d:
      bVar3 = Compiler::is_pointer((Compiler *)this,type);
      if ((bVar3) && (bVar3 = Compiler::is_pointer((Compiler *)this,pSVar6), bVar3)) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_60,this,pSVar6,(ulong)id);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_80,(spirv_cross *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1,
                   (char (*) [2])&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1,
                   in_R9);
        ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if (local_60[0] != local_50) {
          operator_delete(local_60[0]);
        }
      }
      else {
        while (bVar3 = Compiler::is_pointer((Compiler *)this,pSVar6), bVar3) {
          pSVar6 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr + (pSVar6->parent_type).id)
          ;
        }
        bVar3 = this->is_using_builtin_array;
        bVar4 = Compiler::is_physical_pointer((Compiler *)this,type);
        if (bVar4) {
          this->is_using_builtin_array = false;
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_60,this,pSVar6,(ulong)id);
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                  (&local_80,(spirv_cross *)&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1,
                   (char (*) [2])local_60,ts_2);
        ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if (local_60[0] != local_50) {
          operator_delete(local_60[0]);
        }
        this->is_using_builtin_array = bVar3;
      }
      if (2 < type->basetype - Image) {
        ::std::__cxx11::string::append((char *)&local_a0);
        pcVar8 = to_restrict(this,id,false);
        if (*pcVar8 != '\0') {
          ::std::__cxx11::string::append((char *)&local_a0);
          ::std::__cxx11::string::append((char *)&local_a0);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,local_a0.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_a0.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_a0._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,local_a0.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_a0._M_string_length;
    }
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    goto LAB_00226451;
  }
  switch(type->basetype) {
  case Void:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"void","");
    goto LAB_0022645b;
  case Boolean:
    pSVar7 = Compiler::maybe_get_backing_variable((Compiler *)this,id);
    if (pSVar7 == (SPIRVariable *)0x0) {
      if (type->storage == StorageClassWorkgroup || member) goto LAB_0022675d;
LAB_00226c6a:
      pcVar8 = "bool";
    }
    else {
      uVar10 = (ulong)(pSVar7->basevariable).id;
      if (uVar10 != 0) {
        pSVar7 = Variant::get<spirv_cross::SPIRVariable>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + uVar10);
      }
      if ((type->storage != StorageClassWorkgroup && !member) &&
          pSVar7->storage != StorageClassWorkgroup) goto LAB_00226c6a;
LAB_0022675d:
      pcVar8 = "short";
    }
    ::std::__cxx11::string::operator=((string *)&local_a0,pcVar8);
    goto LAB_00226896;
  case SByte:
  case Char:
    pcVar8 = "char";
    break;
  case UByte:
    pcVar8 = "uchar";
    break;
  case Short:
    pcVar8 = "short";
    break;
  case UShort:
    pcVar8 = "ushort";
    break;
  case Int:
    pcVar8 = "int";
    break;
  case UInt:
    pcVar8 = "uint";
    break;
  case Int64:
    if ((this->msl_options).msl_version < 0x4ee8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,"64-bit integers are only supported in MSL 2.2 and above.");
LAB_00226cf7:
      *(undefined ***)this_00 = &PTR__runtime_error_0035bd08;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar8 = "long";
    break;
  case UInt64:
    if ((this->msl_options).msl_version < 0x4ee8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,"64-bit integers are only supported in MSL 2.2 and above.");
      goto LAB_00226cf7;
    }
    pcVar8 = "ulong";
    break;
  case AtomicCounter:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"atomic_uint","");
    goto LAB_0022645b;
  case Half:
    pcVar8 = "half";
    break;
  case Float:
    pcVar8 = "float";
    break;
  case Double:
    pcVar8 = "double";
    break;
  case Struct:
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_c0,this,(ulong)(type->super_IVariant).self.id,1);
    ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    goto LAB_00226896;
  case Image:
  case SampledImage:
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
              (__return_storage_ptr__,this,type,(ulong)id,member);
    goto LAB_0022645b;
  case Sampler:
    sampler_type_abi_cxx11_(__return_storage_ptr__,this,type,id,member);
    goto LAB_0022645b;
  case AccelerationStructure:
    uVar1 = (this->msl_options).msl_version;
    if (uVar1 < 0x4fb0) {
      if (uVar1 < 0x4f4c) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (this_00,"Acceleration Structure Type is supported in MSL 2.3 and above.");
        goto LAB_00226cf7;
      }
      pcVar8 = "raytracing::instance_acceleration_structure";
    }
    else {
      pcVar8 = "raytracing::acceleration_structure<raytracing::instancing>";
    }
    break;
  case RayQuery:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               "raytracing::intersection_query<raytracing::instancing, raytracing::triangle_data>",
               "");
    goto LAB_0022645b;
  case ControlPointArray:
    pSVar6 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + (type->parent_type).id);
    ts_2_00 = (char (*) [2])(this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
    (**(_func_int **)(ts_2_00 + 0x4c))(&local_c0,this,pSVar6,(ulong)id);
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)"patch_control_point<",(char (*) [21])&local_c0
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d188a,
               ts_2_00);
    goto LAB_00226451;
  case Interpolant:
    pSVar6 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + (type->parent_type).id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (&local_c0,this,pSVar6,(ulong)id);
    bVar3 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationNoPerspective);
    pcVar8 = "centroid_perspective";
    if (bVar3) {
      pcVar8 = "centroid_no_perspective";
    }
    local_80._M_dataplus._M_p = pcVar8 + 9;
    join<char_const(&)[13],std::__cxx11::string,char_const(&)[18],char_const*,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)"interpolant<",(char (*) [13])&local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ", interpolation::",(char (*) [18])&local_80,(char **)0x2d188a,
               in_stack_ffffffffffffff28);
    goto LAB_00226451;
  case MeshGridProperties:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"mesh_grid_properties","");
    goto LAB_0022645b;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"unknown_type","");
    goto LAB_0022645b;
  }
  ::std::__cxx11::string::operator=((string *)&local_a0,pcVar8);
LAB_00226896:
  if (1 < type->columns) {
    pSVar7 = Compiler::maybe_get_backing_variable((Compiler *)this,id);
    if (pSVar7 == (SPIRVariable *)0x0) {
LAB_002268d4:
      if (type->storage == StorageClassWorkgroup) goto LAB_002268de;
    }
    else {
      uVar10 = (ulong)(pSVar7->basevariable).id;
      if (uVar10 != 0) {
        pSVar7 = Variant::get<spirv_cross::SPIRVariable>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + uVar10);
      }
      if (pSVar7->storage != StorageClassWorkgroup) goto LAB_002268d4;
LAB_002268de:
      if ((this->msl_options).msl_version < 30000) {
        add_spv_func_and_recompile(this,SPVFuncImplStorageMatrix);
        ::std::operator+(&local_c0,"spvStorage_",&local_a0);
        ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
    }
    uVar1 = type->columns;
    cVar5 = '\x01';
    if (9 < uVar1) {
      uVar12 = uVar1;
      cVar2 = '\x04';
      do {
        cVar5 = cVar2;
        if (uVar12 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_00226984;
        }
        if (uVar12 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_00226984;
        }
        if (uVar12 < 10000) goto LAB_00226984;
        bVar3 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar2 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_00226984:
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_80,cVar5);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_80._M_dataplus._M_p,(uint)local_80._M_string_length,uVar1);
    plVar9 = (long *)::std::__cxx11::string::append((char *)&local_80);
    puVar11 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_c0.field_2._M_allocated_capacity = *puVar11;
      local_c0.field_2._8_8_ = plVar9[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *puVar11;
      local_c0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_c0._M_string_length = plVar9[1];
    *plVar9 = (long)puVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  uVar1 = type->vecsize;
  if (1 < uVar1) {
    cVar5 = '\x01';
    if (9 < uVar1) {
      uVar12 = uVar1;
      cVar2 = '\x04';
      do {
        cVar5 = cVar2;
        if (uVar12 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_00226a8f;
        }
        if (uVar12 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_00226a8f;
        }
        if (uVar12 < 10000) goto LAB_00226a8f;
        bVar3 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar2 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_00226a8f:
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_c0,cVar5);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,uVar1);
    ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if ((((type->array).super_VectorView<unsigned_int>.buffer_size == 0) ||
      ((this->msl_options).force_native_arrays != false)) ||
     ((this->is_using_builtin_array & 1U) != 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,local_a0.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_a0.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_a0._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,local_a0.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_a0._M_string_length;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    add_spv_func_and_recompile(this,SPVFuncImplUnsafeArray);
    local_40 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
    index = 0;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_allocated_capacity =
         local_c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if ((int)(type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
      do {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)&local_c0);
        CompilerGLSL::to_array_size_abi_cxx11_(&local_80,&this->super_CompilerGLSL,type,index);
        ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)&local_c0);
        index = index + 1;
      } while (index < (uint)(type->array).super_VectorView<unsigned_int>.buffer_size);
    }
    ::std::operator+(&local_80,&local_a0,&local_c0);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
LAB_00226451:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
LAB_0022645b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::type_to_glsl(const SPIRType &type, uint32_t id, bool member)
{
	string type_name;

	// Pointer?
	if (is_pointer(type) || type_is_array_of_pointers(type))
	{
		assert(type.pointer_depth > 0);

		const char *restrict_kw;

		auto type_address_space = get_type_address_space(type, id);
		const auto *p_parent_type = &get<SPIRType>(type.parent_type);

		// If we're wrapping buffer descriptors in a spvDescriptorArray, we'll have to handle it as a special case.
		if (member && id)
		{
			auto &var = get<SPIRVariable>(id);
			if (is_var_runtime_size_array(var) && is_runtime_size_array(*p_parent_type))
			{
				const bool ssbo = has_decoration(p_parent_type->self, DecorationBufferBlock);
				bool buffer_desc =
						(var.storage == StorageClassStorageBuffer || ssbo) &&
						msl_options.runtime_array_rich_descriptor;

				const char *wrapper_type = buffer_desc ? "spvBufferDescriptor" : "spvDescriptor";
				add_spv_func_and_recompile(SPVFuncImplVariableDescriptorArray);
				add_spv_func_and_recompile(buffer_desc ? SPVFuncImplVariableSizedDescriptor : SPVFuncImplVariableDescriptor);

				type_name = join(wrapper_type, "<", type_address_space, " ", type_to_glsl(*p_parent_type, id), " *>");
				return type_name;
			}
		}

		// Work around C pointer qualifier rules. If glsl_type is a pointer type as well
		// we'll need to emit the address space to the right.
		// We could always go this route, but it makes the code unnatural.
		// Prefer emitting thread T *foo over T thread* foo since it's more readable,
		// but we'll have to emit thread T * thread * T constant bar; for example.
		if (is_pointer(type) && is_pointer(*p_parent_type))
			type_name = join(type_to_glsl(*p_parent_type, id), " ", type_address_space, " ");
		else
		{
			// Since this is not a pointer-to-pointer, ensure we've dug down to the base type.
			// Some situations chain pointers even though they are not formally pointers-of-pointers.
			while (is_pointer(*p_parent_type))
				p_parent_type = &get<SPIRType>(p_parent_type->parent_type);

			// If we're emitting BDA, just use the templated type.
			// Emitting builtin arrays need a lot of cooperation with other code to ensure
			// the C-style nesting works right.
			// FIXME: This is somewhat of a hack.
			bool old_is_using_builtin_array = is_using_builtin_array;
			if (is_physical_pointer(type))
				is_using_builtin_array = false;

			type_name = join(type_address_space, " ", type_to_glsl(*p_parent_type, id));

			is_using_builtin_array = old_is_using_builtin_array;
		}

		switch (type.basetype)
		{
		case SPIRType::Image:
		case SPIRType::SampledImage:
		case SPIRType::Sampler:
			// These are handles.
			break;
		default:
			// Anything else can be a raw pointer.
			type_name += "*";
			restrict_kw = to_restrict(id, false);
			if (*restrict_kw)
			{
				type_name += " ";
				type_name += restrict_kw;
			}
			break;
		}
		return type_name;
	}

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		// Allow Metal to use the array<T> template to make arrays a value type
		type_name = to_name(type.self);
		break;

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_glsl(type, id, member);

	case SPIRType::Sampler:
		return sampler_type(type, id, member);

	case SPIRType::Void:
		return "void";

	case SPIRType::AtomicCounter:
		return "atomic_uint";

	case SPIRType::ControlPointArray:
		return join("patch_control_point<", type_to_glsl(get<SPIRType>(type.parent_type), id), ">");

	case SPIRType::Interpolant:
		return join("interpolant<", type_to_glsl(get<SPIRType>(type.parent_type), id), ", interpolation::",
		            has_decoration(type.self, DecorationNoPerspective) ? "no_perspective" : "perspective", ">");

	// Scalars
	case SPIRType::Boolean:
	{
		auto *var = maybe_get_backing_variable(id);
		if (var && var->basevariable)
			var = &get<SPIRVariable>(var->basevariable);

		// Need to special-case threadgroup booleans. They are supposed to be logical
		// storage, but MSL compilers will sometimes crash if you use threadgroup bool.
		// Workaround this by using 16-bit types instead and fixup on load-store to this data.
		if ((var && var->storage == StorageClassWorkgroup) || type.storage == StorageClassWorkgroup || member)
			type_name = "short";
		else
			type_name = "bool";
		break;
	}

	case SPIRType::Char:
	case SPIRType::SByte:
		type_name = "char";
		break;
	case SPIRType::UByte:
		type_name = "uchar";
		break;
	case SPIRType::Short:
		type_name = "short";
		break;
	case SPIRType::UShort:
		type_name = "ushort";
		break;
	case SPIRType::Int:
		type_name = "int";
		break;
	case SPIRType::UInt:
		type_name = "uint";
		break;
	case SPIRType::Int64:
		if (!msl_options.supports_msl_version(2, 2))
			SPIRV_CROSS_THROW("64-bit integers are only supported in MSL 2.2 and above.");
		type_name = "long";
		break;
	case SPIRType::UInt64:
		if (!msl_options.supports_msl_version(2, 2))
			SPIRV_CROSS_THROW("64-bit integers are only supported in MSL 2.2 and above.");
		type_name = "ulong";
		break;
	case SPIRType::Half:
		type_name = "half";
		break;
	case SPIRType::Float:
		type_name = "float";
		break;
	case SPIRType::Double:
		type_name = "double"; // Currently unsupported
		break;
	case SPIRType::AccelerationStructure:
		if (msl_options.supports_msl_version(2, 4))
			type_name = "raytracing::acceleration_structure<raytracing::instancing>";
		else if (msl_options.supports_msl_version(2, 3))
			type_name = "raytracing::instance_acceleration_structure";
		else
			SPIRV_CROSS_THROW("Acceleration Structure Type is supported in MSL 2.3 and above.");
		break;
	case SPIRType::RayQuery:
		return "raytracing::intersection_query<raytracing::instancing, raytracing::triangle_data>";
	case SPIRType::MeshGridProperties:
		return "mesh_grid_properties";

	default:
		return "unknown_type";
	}

	// Matrix?
	if (type.columns > 1)
	{
		auto *var = maybe_get_backing_variable(id);
		if (var && var->basevariable)
			var = &get<SPIRVariable>(var->basevariable);

		// Need to special-case threadgroup matrices. Due to an oversight, Metal's
		// matrix struct prior to Metal 3 lacks constructors in the threadgroup AS,
		// preventing us from default-constructing or initializing matrices in threadgroup storage.
		// Work around this by using our own type as storage.
		if (((var && var->storage == StorageClassWorkgroup) || type.storage == StorageClassWorkgroup) &&
		    !msl_options.supports_msl_version(3, 0))
		{
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			type_name = "spvStorage_" + type_name;
		}

		type_name += to_string(type.columns) + "x";
	}

	// Vector or Matrix?
	if (type.vecsize > 1)
		type_name += to_string(type.vecsize);

	if (type.array.empty() || using_builtin_array())
	{
		return type_name;
	}
	else
	{
		// Allow Metal to use the array<T> template to make arrays a value type
		add_spv_func_and_recompile(SPVFuncImplUnsafeArray);
		string res;
		string sizes;

		for (uint32_t i = 0; i < uint32_t(type.array.size()); i++)
		{
			res += "spvUnsafeArray<";
			sizes += ", ";
			sizes += to_array_size(type, i);
			sizes += ">";
		}

		res += type_name + sizes;
		return res;
	}
}